

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O2

void __thiscall ASDCP::UMID::MakeUMID(UMID *this,int Type,UUID *AssetID)

{
  undefined8 uVar1;
  
  (this->super_Identifier<32U>).m_Value[0] = '\x06';
  (this->super_Identifier<32U>).m_Value[1] = '\n';
  (this->super_Identifier<32U>).m_Value[2] = '+';
  (this->super_Identifier<32U>).m_Value[3] = '4';
  (this->super_Identifier<32U>).m_Value[4] = '\x01';
  (this->super_Identifier<32U>).m_Value[5] = '\x01';
  (this->super_Identifier<32U>).m_Value[6] = '\x01';
  (this->super_Identifier<32U>).m_Value[7] = '\x01';
  (this->super_Identifier<32U>).m_Value[8] = '\x01';
  (this->super_Identifier<32U>).m_Value[9] = '\x01';
  (this->super_Identifier<32U>).m_Value[10] = (byte_t)Type;
  (this->super_Identifier<32U>).m_Value[0xc] = '\x13';
  if (4 < Type) {
    (this->super_Identifier<32U>).m_Value[7] = '\x05';
  }
  (this->super_Identifier<32U>).m_Value[0xb] = ' ';
  (this->super_Identifier<32U>).m_Value[0xf] = '\0';
  (this->super_Identifier<32U>).m_Value[0xd] = '\0';
  (this->super_Identifier<32U>).m_Value[0xe] = '\0';
  uVar1 = *(undefined8 *)((AssetID->super_Identifier<16U>).m_Value + 8);
  *(undefined8 *)((this->super_Identifier<32U>).m_Value + 0x10) =
       *(undefined8 *)(AssetID->super_Identifier<16U>).m_Value;
  *(undefined8 *)((this->super_Identifier<32U>).m_Value + 0x18) = uVar1;
  (this->super_Identifier<32U>).m_HasValue = true;
  return;
}

Assistant:

void
ASDCP::UMID::MakeUMID(int Type, const UUID& AssetID)
{
  // Set the non-varying base of the UMID
  static const byte_t UMIDBase[10] = { 0x06, 0x0a, 0x2b, 0x34, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01 };
  memcpy(m_Value, UMIDBase, 10);
  m_Value[10] = Type;  // Material Type
  m_Value[12] = 0x13;  // length

  // preserved for compatibility with mfxlib
  if( Type > 4 ) m_Value[7] = 5;
  m_Value[11] = 0x20; // UUID/UL method, number gen undefined

  // Instance Number
  m_Value[13] = m_Value[14] = m_Value[15] = 0;
  
  memcpy(&m_Value[16], AssetID.Value(), AssetID.Size());
  m_HasValue = true;
}